

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O2

void __thiscall
glslang::TIntermediate::mergeTrees(TIntermediate *this,TInfoSink *infoSink,TIntermediate *unit)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  TIntermSequence *globals;
  undefined4 extraout_var_00;
  TIntermSequence *unitGlobals;
  TIntermAggregate *pTVar3;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  TIntermediate *this_00;
  longlong idShift;
  TIdMaps idMaps;
  long local_118;
  TIdMaps local_110;
  
  if (unit->treeRoot != (TIntermNode *)0x0) {
    if (this->treeRoot == (TIntermNode *)0x0) {
      this->treeRoot = unit->treeRoot;
    }
    else {
      this->numShaderRecordBlocks = this->numShaderRecordBlocks + unit->numShaderRecordBlocks;
      this->numTaskNVBlocks = this->numTaskNVBlocks + unit->numTaskNVBlocks;
      iVar1 = (*this->treeRoot->_vptr_TIntermNode[6])();
      globals = (TIntermSequence *)
                (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 400))
                          ((long *)CONCAT44(extraout_var,iVar1));
      iVar1 = (*unit->treeRoot->_vptr_TIntermNode[6])();
      unitGlobals = (TIntermSequence *)
                    (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 400))
                              ((long *)CONCAT44(extraout_var_00,iVar1));
      pTVar3 = findLinkerObjects(this);
      iVar1 = (*(pTVar3->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x32])(pTVar3);
      pTVar3 = findLinkerObjects(unit);
      iVar2 = (*(pTVar3->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x32])(pTVar3);
      TIdMaps::TIdMaps(&local_110);
      this_00 = this;
      seedIdMap(this,&local_110,&local_118);
      remapIds(this_00,&local_110,local_118 + 1,unit);
      mergeBodies(this,infoSink,globals,unitGlobals);
      mergeGlobalUniformBlocks(this,infoSink,unit,false);
      mergeLinkerObjects(this,infoSink,(TIntermSequence *)CONCAT44(extraout_var_01,iVar1),
                         (TIntermSequence *)CONCAT44(extraout_var_02,iVar2),unit->language);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::_Identity<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,std::less<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,std::allocator<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>>
      ::
      _M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>>
                ((_Rb_tree<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::_Identity<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,std::less<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,std::allocator<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>>
                  *)&this->ioAccessed,
                 (unit->ioAccessed)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                 (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>
                  )&(unit->ioAccessed)._M_t._M_impl.super__Rb_tree_header);
      TIdMaps::~TIdMaps(&local_110);
    }
  }
  return;
}

Assistant:

void TIntermediate::mergeTrees(TInfoSink& infoSink, TIntermediate& unit)
{
    if (unit.treeRoot == nullptr)
        return;

    if (treeRoot == nullptr) {
        treeRoot = unit.treeRoot;
        return;
    }

    // Getting this far means we have two existing trees to merge...
    numShaderRecordBlocks += unit.numShaderRecordBlocks;
    numTaskNVBlocks += unit.numTaskNVBlocks;

    // Get the top-level globals of each unit
    TIntermSequence& globals = treeRoot->getAsAggregate()->getSequence();
    TIntermSequence& unitGlobals = unit.treeRoot->getAsAggregate()->getSequence();

    // Get the linker-object lists
    TIntermSequence& linkerObjects = findLinkerObjects()->getSequence();
    const TIntermSequence& unitLinkerObjects = unit.findLinkerObjects()->getSequence();

    // Map by global name to unique ID to rationalize the same object having
    // differing IDs in different trees.
    TIdMaps idMaps;
    long long idShift;
    seedIdMap(idMaps, idShift);
    remapIds(idMaps, idShift + 1, unit);

    mergeBodies(infoSink, globals, unitGlobals);
    bool mergeExistingOnly = false;
    mergeGlobalUniformBlocks(infoSink, unit, mergeExistingOnly);
    mergeLinkerObjects(infoSink, linkerObjects, unitLinkerObjects, unit.getStage());
    ioAccessed.insert(unit.ioAccessed.begin(), unit.ioAccessed.end());
}